

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# attr.h
# Opt level: O2

void __thiscall
pybind11::detail::type_record::add_base
          (type_record *this,type_info *base,_func_void_ptr_void_ptr *caster)

{
  type_info *ptVar1;
  char *pcVar2;
  string tname;
  allocator local_149;
  string local_148;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_128;
  _func_void_ptr_void_ptr *local_108;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_100;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_e0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_c0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_80;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_60;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_40;
  
  local_148._M_dataplus._M_p = (pointer)base;
  local_108 = caster;
  ptVar1 = get_type_info((type_index *)&local_148,false);
  if (ptVar1 == (type_info *)0x0) {
    std::__cxx11::string::string
              ((string *)&local_148,*(char **)(base + 8) + (**(char **)(base + 8) == '*'),
               (allocator *)&local_128);
    clean_type_id(&local_148);
    std::__cxx11::string::string((string *)&local_100,this->name,(allocator *)&local_80);
    std::operator+(&local_e0,"generic_type: type \"",&local_100);
    std::operator+(&local_c0,&local_e0,"\" referenced unknown base type \"");
    std::operator+(&local_a0,&local_c0,&local_148);
    std::operator+(&local_128,&local_a0,"\"");
    pybind11_fail(&local_128);
  }
  if ((((byte)ptVar1->field_0x88 >> 2 ^ (byte)this->field_0x58 >> 3) & 1) == 0) {
    local_148._M_dataplus._M_p = (pointer)ptVar1->type;
    list::append<_object*>(&this->bases,(_object **)&local_148);
    if (ptVar1->type->tp_dictoffset != 0) {
      this->field_0x58 = this->field_0x58 | 2;
    }
    if (caster != (_func_void_ptr_void_ptr *)0x0) {
      std::
      vector<std::pair<std::type_info_const*,void*(*)(void*)>,std::allocator<std::pair<std::type_info_const*,void*(*)(void*)>>>
      ::emplace_back<std::type_info_const*&,void*(*&)(void*)>
                ((vector<std::pair<std::type_info_const*,void*(*)(void*)>,std::allocator<std::pair<std::type_info_const*,void*(*)(void*)>>>
                  *)&ptVar1->implicit_casts,&this->type,&local_108);
    }
    return;
  }
  std::__cxx11::string::string
            ((string *)&local_148,*(char **)(base + 8) + (**(char **)(base + 8) == '*'),
             (allocator *)&local_128);
  clean_type_id(&local_148);
  std::__cxx11::string::string((string *)&local_60,this->name,&local_149);
  std::operator+(&local_40,"generic_type: type \"",&local_60);
  std::operator+(&local_80,&local_40,"\" ");
  pcVar2 = "does not have";
  if ((this->field_0x58 & 8) == 0) {
    pcVar2 = "has";
  }
  std::operator+(&local_100,&local_80,pcVar2);
  std::operator+(&local_e0,&local_100," a non-default holder type while its base \"");
  std::operator+(&local_c0,&local_e0,&local_148);
  std::operator+(&local_a0,&local_c0,"\" ");
  pcVar2 = "does not";
  if ((ptVar1->field_0x88 & 4) == 0) {
    pcVar2 = "does";
  }
  std::operator+(&local_128,&local_a0,pcVar2);
  pybind11_fail(&local_128);
}

Assistant:

PYBIND11_NOINLINE void add_base(const std::type_info &base, void *(*caster)(void *)) {
        auto base_info = detail::get_type_info(base, false);
        if (!base_info) {
            std::string tname(base.name());
            detail::clean_type_id(tname);
            pybind11_fail("generic_type: type \"" + std::string(name) +
                          "\" referenced unknown base type \"" + tname + "\"");
        }

        if (default_holder != base_info->default_holder) {
            std::string tname(base.name());
            detail::clean_type_id(tname);
            pybind11_fail("generic_type: type \"" + std::string(name) + "\" " +
                    (default_holder ? "does not have" : "has") +
                    " a non-default holder type while its base \"" + tname + "\" " +
                    (base_info->default_holder ? "does not" : "does"));
        }

        bases.append((PyObject *) base_info->type);

        if (base_info->type->tp_dictoffset != 0)
            dynamic_attr = true;

        if (caster)
            base_info->implicit_casts.emplace_back(type, caster);
    }